

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

void __thiscall QDirSortItem::QDirSortItem(QDirSortItem *this,QFileInfo *fi,SortFlags sort)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->suffix_cache).d.ptr = (char16_t *)0x0;
  (this->suffix_cache).d.size = 0;
  (this->filename_cache).d.size = 0;
  (this->suffix_cache).d.d = (Data *)0x0;
  (this->filename_cache).d.d = (Data *)0x0;
  (this->filename_cache).d.ptr = (char16_t *)0x0;
  QFileInfo::QFileInfo(&this->item,fi);
  if ((char)sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i
      < '\0') {
    QFileInfo::suffix((QString *)&local_48,&this->item);
    pDVar2 = (this->suffix_cache).d.d;
    pcVar3 = (this->suffix_cache).d.ptr;
    (this->suffix_cache).d.d = local_48.d;
    (this->suffix_cache).d.ptr = local_48.ptr;
    qVar1 = (this->suffix_cache).d.size;
    (this->suffix_cache).d.size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pcVar3;
    local_48.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDirSortItem(const QFileInfo &fi, QDir::SortFlags sort)
        : item(fi)
    {
        // A dir e.g. "dirA.bar" doesn't have actually have an extension/suffix, when
        // sorting by type such "suffix" should be ignored but that would complicate
        // the code and uses can change the behavior by setting DirsFirst/DirsLast
        if (sort.testAnyFlag(QDir::Type))
            suffix_cache = item.suffix();
    }